

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

void AddByte(Lexer *lexer,tmbchar ch)

{
  uint uVar1;
  tmbstr ptVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = lexer->lexlength;
  if (uVar1 <= lexer->lexsize + 2) {
    uVar4 = uVar1;
    uVar3 = uVar1;
    if (uVar1 <= lexer->lexsize + 2) {
      do {
        uVar4 = uVar3 * 2;
        if (uVar3 == 0) {
          uVar4 = 0x2000;
        }
        if (uVar4 < uVar1) {
          (*lexer->allocator->vtbl->panic)
                    (lexer->allocator,"\nPanic: out of internal memory!\nDocument input too big!\n")
          ;
        }
        uVar3 = uVar4;
      } while (uVar4 <= lexer->lexsize + 2);
    }
    ptVar2 = (tmbstr)(*lexer->allocator->vtbl->realloc)
                               (lexer->allocator,lexer->lexbuf,(size_t)uVar4);
    if (ptVar2 != (tmbstr)0x0) {
      memset(ptVar2 + lexer->lexlength,0,(ulong)(uVar4 - lexer->lexlength));
      lexer->lexbuf = ptVar2;
      lexer->lexlength = uVar4;
    }
  }
  uVar1 = lexer->lexsize;
  lexer->lexsize = uVar1 + 1;
  lexer->lexbuf[uVar1] = ch;
  lexer->lexbuf[lexer->lexsize] = '\0';
  return;
}

Assistant:

static void AddByte( Lexer *lexer, tmbchar ch )
{
    if ( lexer->lexsize + 2 >= lexer->lexlength )
    {
        tmbstr buf = NULL;
        uint allocAmt = lexer->lexlength;
        uint prev = allocAmt; /* Is. #761 */
        while ( lexer->lexsize + 2 >= allocAmt )
        {
            if ( allocAmt == 0 )
                allocAmt = 8192;
            else
                allocAmt *= 2;
            if (allocAmt < prev) /* Is. #761 - watch for wrap - and */
                TidyPanic(lexer->allocator, "\nPanic: out of internal memory!\nDocument input too big!\n");
        }
        buf = (tmbstr) TidyRealloc( lexer->allocator, lexer->lexbuf, allocAmt );
        if ( buf )
        {
          TidyClearMemory( buf + lexer->lexlength, 
                           allocAmt - lexer->lexlength );
          lexer->lexbuf = buf;
          lexer->lexlength = allocAmt;
        }
    }

    lexer->lexbuf[ lexer->lexsize++ ] = ch;
    lexer->lexbuf[ lexer->lexsize ]   = '\0';  /* debug */
}